

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test::
QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test
          (QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test
           *this)

{
  QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test
  *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__QueryTests_SelectAll_WithCriteria_canDetermineSpecificationForSelectAllWithCriteria_Test_001a4ae8
  ;
  return;
}

Assistant:

TEST(QueryTests_SelectAll_WithCriteria,canDetermineSpecificationForSelectAllWithCriteria)
{
  database::Query query_select_all_with_criteria = "select * from company.employee where employee_status <> parttime";
  ASSERT_TRUE(query_select_all_with_criteria.transactionType() == database::select_all);
  ASSERT_TRUE(query_select_all_with_criteria.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_all_with_criteria.databaseName() == "company");
  ASSERT_TRUE(query_select_all_with_criteria.containerName() == "employee");
  database::api_filter_type filter = {
    {"employee_status",{{"parttime",database::not_equal_to}}}
  };
  ASSERT_TRUE(query_select_all_with_criteria.filter() == filter);
}